

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void nivalis::util::ltrim(string *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  undefined8 local_20;
  undefined8 local_10;
  
  std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_RDI,in_stack_ffffffffffffffa8);
  uVar1 = std::__cxx11::string::begin();
  uVar2 = std::__cxx11::string::end();
  std::
  find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,nivalis::util::ltrim(std::__cxx11::string&)::__0>
            (uVar1,uVar2);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::erase(in_RDI,local_10,local_20);
  return;
}

Assistant:

void ltrim(std::string& s) {
    s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](int ch) {
        return !::std::isspace(ch);
    }));
}